

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::compiler::cpp::MessageGenerator::RequiredFieldsBitMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MessageGenerator *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type __n;
  FieldDescriptor *this_00;
  char *pcVar4;
  const_reference pvVar5;
  reference pvVar6;
  int __c;
  int has_bit_index;
  FieldDescriptor *field;
  int i;
  allocator<unsigned_int> local_25;
  value_type_conflict3 local_24;
  undefined1 local_1d;
  int local_1c;
  MessageGenerator *pMStack_18;
  int array_size;
  MessageGenerator *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *masks;
  
  pMStack_18 = this;
  this_local = (MessageGenerator *)__return_storage_ptr__;
  sVar3 = HasBitsSize(this);
  local_1c = (int)sVar3;
  local_1d = 0;
  __n = (size_type)local_1c;
  local_24 = 0;
  std::allocator<unsigned_int>::allocator(&local_25);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,&local_24,&local_25);
  std::allocator<unsigned_int>::~allocator(&local_25);
  for (field._0_4_ = 0; iVar2 = Descriptor::field_count(this->descriptor_), (int)(uint)field < iVar2
      ; field._0_4_ = (uint)field + 1) {
    pcVar4 = (char *)(ulong)(uint)field;
    this_00 = Descriptor::field(this->descriptor_,(uint)field);
    bVar1 = FieldDescriptor::is_required(this_00);
    if (bVar1) {
      pcVar4 = FieldDescriptor::index(this_00,pcVar4,__c);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->has_bit_indices_,(long)(int)pcVar4);
      iVar2 = *pvVar5;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(long)(iVar2 / 0x20));
      *pvVar6 = 1 << ((byte)((long)iVar2 % 0x20) & 0x1f) | *pvVar6;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32> MessageGenerator::RequiredFieldsBitMask() const {
  const int array_size = HasBitsSize();
  std::vector<uint32> masks(array_size, 0);

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!field->is_required()) {
      continue;
    }

    const int has_bit_index = has_bit_indices_[field->index()];
    masks[has_bit_index / 32] |=
        static_cast<uint32>(1) << (has_bit_index % 32);
  }
  return masks;
}